

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_assignUnitsItemIdBadInput_Test::TestBody(Annotator_assignUnitsItemIdBadInput_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  shared_ptr asStack_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Annotator::create();
  local_38 = 0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::UnitsItem::create(asStack_78,(ulong)&local_38);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_68);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_48,"\"\"","annotator->assignId(libcellml::UnitsItem::create(nullptr, 0))",
             (char (*) [1])0x168c1a,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)asStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x484,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)asStack_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)asStack_78);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_68._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38 = 0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::UnitsItem::create(asStack_78,(ulong)&local_38);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_68);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_48,"\"\"",
             "annotator->assignId(libcellml::UnitsItem::create(nullptr, std::numeric_limits<size_t>::max()))"
             ,(char (*) [1])0x168c1a,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)asStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x485,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)asStack_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)asStack_78);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_68._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Annotator, assignUnitsItemIdBadInput)
{
    auto annotator = libcellml::Annotator::create();
    EXPECT_EQ("", annotator->assignId(libcellml::UnitsItem::create(nullptr, 0)));
    EXPECT_EQ("", annotator->assignId(libcellml::UnitsItem::create(nullptr, std::numeric_limits<size_t>::max())));
}